

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O1

void testWithTranslateRotateAndScale<float>(M44d *m)

{
  undefined8 uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar11;
  undefined1 auVar14 [16];
  float fVar16;
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  undefined4 uVar19;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> from;
  Rand48 rand;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> to;
  vector<float,_std::allocator<float>_> weights;
  Vec3 *local_1b8;
  Vec3 *pVStack_1b0;
  long local_1a8;
  ushort local_196 [3];
  double local_190;
  float *local_188;
  undefined8 uStack_180;
  long local_178;
  vector<float,_std::allocator<float>_> local_168;
  Vec3<float> local_148;
  undefined4 uStack_13c;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  float local_b8;
  float fStack_b4;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing with known translate/rotate/scale matrix\n",0x31);
  Imath_3_2::operator<<((ostream *)&std::cout,m);
  local_196[0] = 0xd35a;
  local_196[1] = 0xc826;
  local_196[2] = 0xd35a;
  local_1a8 = 0;
  local_1b8 = (Vec3 *)0x0;
  pVStack_1b0 = (Vec3 *)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numPoints: ",0xb);
  std::ostream::flush();
  lVar8 = 1;
  do {
    local_190 = (double)Imath_3_2::erand48(local_196);
    local_c8 = (double)Imath_3_2::erand48(local_196);
    dVar9 = (double)Imath_3_2::erand48(local_196);
    local_148.x = (float)local_190;
    local_148.y = (float)local_c8;
    local_148.z = (float)dVar9;
    std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
    emplace_back<Imath_3_2::Vec3<float>>
              ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_1b8,
               &local_148);
    dVar9 = (double)Imath_3_2::erand48(local_196);
    local_148.x = (float)dVar9;
    if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_168,
                 (iterator)
                 local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_148.x);
    }
    else {
      *local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_148.x;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    local_188 = (float *)0x0;
    uStack_180 = 0;
    local_178 = 0;
    local_190 = (double)lVar8;
    if (pVStack_1b0 == local_1b8) {
      uVar6 = 0;
    }
    else {
      lVar8 = 8;
      uVar7 = 0;
      do {
        dVar9 = (double)*(float *)(local_1b8 + lVar8 + -8);
        dVar2 = (double)*(float *)(local_1b8 + lVar8 + -4);
        dVar10 = (double)*(float *)(local_1b8 + lVar8);
        dVar11 = m->x[2][3] * dVar10 + m->x[0][3] * dVar9 + m->x[1][3] * dVar2 + m->x[3][3];
        uVar19 = (undefined4)((ulong)dVar11 >> 0x20);
        fVar18 = (float)dVar11;
        local_148.z = (float)(m->x[2][2] * dVar10 + m->x[0][2] * dVar9 + m->x[1][2] * dVar2 +
                             m->x[3][2]) / fVar18;
        auVar12._0_4_ =
             (float)(dVar10 * m->x[2][0] + dVar9 * m->x[0][0] + m->x[1][0] * dVar2 + m->x[3][0]);
        auVar12._4_4_ =
             (float)(dVar10 * m->x[2][1] + dVar9 * m->x[0][1] + m->x[1][1] * dVar2 + m->x[3][1]);
        auVar12._8_8_ = 0;
        auVar13._4_4_ = fVar18;
        auVar13._0_4_ = fVar18;
        auVar13._8_4_ = uVar19;
        auVar13._12_4_ = uVar19;
        auVar13 = divps(auVar12,auVar13);
        local_148.x = auVar13._0_4_;
        local_148.y = auVar13._4_4_;
        std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
        emplace_back<Imath_3_2::Vec3<float>>
                  ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)
                   &local_188,&local_148);
        uVar7 = uVar7 + 1;
        uVar6 = ((long)pVStack_1b0 - (long)local_1b8 >> 2) * -0x5555555555555555;
        lVar8 = lVar8 + 0xc;
      } while (uVar7 < uVar6);
    }
    Imath_3_2::procrustesRotationAndTranslation<float>
              ((Vec3 *)&local_148,local_1b8,local_188,
               (ulong)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,SUB81(uVar6,0));
    if (pVStack_1b0 == local_1b8) {
      uVar6 = 0;
    }
    else {
      lVar8 = 8;
      uVar7 = 0;
      do {
        dVar9 = (double)*(float *)(local_1b8 + lVar8 + -8);
        dVar2 = (double)*(float *)(local_1b8 + lVar8 + -4);
        dVar11 = (double)*(float *)(local_1b8 + lVar8);
        fVar18 = (float)(dStack_f0 * dVar11 + dStack_130 * dVar9 + dStack_110 * dVar2 + dStack_d0);
        auVar14._0_4_ =
             (float)(dVar11 * local_108 +
                     dVar9 * (double)CONCAT44(local_148.y,local_148.x) + dVar2 * local_128 +
                    local_e8);
        auVar14._4_4_ =
             (float)(dVar11 * dStack_100 +
                     dVar9 * (double)CONCAT44(uStack_13c,local_148.z) + dVar2 * dStack_120 +
                    dStack_e0);
        auVar14._8_8_ = 0;
        auVar3._4_4_ = fVar18;
        auVar3._0_4_ = fVar18;
        auVar3._8_4_ = fVar18;
        auVar3._12_4_ = fVar18;
        auVar13 = divps(auVar14,auVar3);
        uVar1 = *(undefined8 *)((long)local_188 + lVar8 + -8);
        fVar17 = (float)(local_f8 * dVar11 + local_138 * dVar9 + local_118 * dVar2 + local_d8) /
                 fVar18 - *(float *)((long)local_188 + lVar8);
        fVar18 = auVar13._0_4_ - (float)uVar1;
        fVar16 = auVar13._4_4_ - (float)((ulong)uVar1 >> 0x20);
        fVar18 = fVar17 * fVar17 + fVar18 * fVar18 + fVar16 * fVar16;
        if (fVar18 < 2.3509887e-38) {
          testWithTranslateRotateAndScale<float>();
          fVar18 = local_b8;
        }
        else if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        if (0.0001 <= fVar18) {
          __assert_fail("(from[i] * res - to[i]).length () < eps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                        ,0x62,
                        "void testWithTranslateRotateAndScale(const Imath_3_2::M44d &) [T = float]")
          ;
        }
        uVar7 = uVar7 + 1;
        uVar6 = ((long)pVStack_1b0 - (long)local_1b8 >> 2) * -0x5555555555555555;
        lVar8 = lVar8 + 0xc;
      } while (uVar7 < uVar6);
    }
    Imath_3_2::procrustesRotationAndTranslation<float>
              ((Vec3 *)&local_b8,local_1b8,(ulong)local_188,SUB81(uVar6,0));
    local_148.x = local_b8;
    local_148.y = fStack_b4;
    local_148.z = (float)uStack_b0;
    uStack_13c = (undefined4)((ulong)uStack_b0 >> 0x20);
    local_138 = local_a8;
    dStack_130 = dStack_a0;
    local_128 = local_98;
    dStack_120 = dStack_90;
    local_118 = local_88;
    dStack_110 = dStack_80;
    local_108 = local_78;
    dStack_100 = dStack_70;
    local_f8 = local_68;
    dStack_f0 = dStack_60;
    local_e8 = local_58;
    dStack_e0 = dStack_50;
    local_d8 = local_48;
    dStack_d0 = dStack_40;
    if (pVStack_1b0 != local_1b8) {
      lVar8 = 8;
      uVar6 = 0;
      do {
        dVar9 = (double)*(float *)(local_1b8 + lVar8 + -8);
        dVar2 = (double)*(float *)(local_1b8 + lVar8 + -4);
        dVar11 = (double)*(float *)(local_1b8 + lVar8);
        fVar18 = (float)(dStack_f0 * dVar11 + dStack_130 * dVar9 + dStack_110 * dVar2 + dStack_d0);
        auVar15._0_4_ =
             (float)(dVar11 * local_108 +
                     dVar9 * (double)CONCAT44(local_148.y,local_148.x) + dVar2 * local_128 +
                    local_e8);
        auVar15._4_4_ =
             (float)(dVar11 * dStack_100 +
                     dVar9 * (double)CONCAT44(uStack_13c,local_148.z) + dVar2 * dStack_120 +
                    dStack_e0);
        auVar15._8_8_ = 0;
        auVar4._4_4_ = fVar18;
        auVar4._0_4_ = fVar18;
        auVar4._8_4_ = fVar18;
        auVar4._12_4_ = fVar18;
        auVar13 = divps(auVar15,auVar4);
        uVar1 = *(undefined8 *)((long)local_188 + lVar8 + -8);
        fVar17 = (float)(local_f8 * dVar11 + local_138 * dVar9 + local_118 * dVar2 + local_d8) /
                 fVar18 - *(float *)((long)local_188 + lVar8);
        fVar18 = auVar13._0_4_ - (float)uVar1;
        fVar16 = auVar13._4_4_ - (float)((ulong)uVar1 >> 0x20);
        fVar18 = fVar17 * fVar17 + fVar18 * fVar18 + fVar16 * fVar16;
        if (fVar18 < 2.3509887e-38) {
          testWithTranslateRotateAndScale<float>();
          fVar18 = local_b8;
        }
        else if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        if (0.0001 <= fVar18) {
          __assert_fail("(from[i] * res - to[i]).length () < eps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                        ,0x68,
                        "void testWithTranslateRotateAndScale(const Imath_3_2::M44d &) [T = float]")
          ;
        }
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0xc;
      } while (uVar6 < (ulong)(((long)pVStack_1b0 - (long)local_1b8 >> 2) * -0x5555555555555555));
    }
    dVar9 = local_190;
    if (local_188 != (float *)0x0) {
      operator_delete(local_188,local_178 - (long)local_188);
    }
    lVar8 = (long)dVar9 + 1;
    if (lVar8 == 10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  OK\n",5);
      if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1b8 != (Vec3 *)0x0) {
        operator_delete(local_1b8,local_1a8 - (long)local_1b8);
      }
      return;
    }
  } while( true );
}

Assistant:

void
testWithTranslateRotateAndScale (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing with known translate/rotate/scale matrix\n" << m;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand (5376);

    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> V3;
    std::vector<V3>                           from;
    std::vector<T>                            weights;

    const float eps = 1e-4f;
    std::cout << "numPoints: " << std::flush;
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        from.push_back (V3(
            static_cast<T>(rand.nextf()),
            static_cast<T>(rand.nextf()),
            static_cast<T>(rand.nextf())));
        weights.push_back(static_cast<T>(rand.nextf()));
        std::cout << from.size () << " ";

        std::vector<V3> to;
        for (size_t i = 0; i < from.size (); ++i)
            to.push_back (from[i] * m);

        // weighted:
        IMATH_INTERNAL_NAMESPACE::M44d res =
            IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (
                &from[0], &to[0], &weights[0], from.size (), true);
        for (size_t i = 0; i < from.size (); ++i)
            assert ((from[i] * res - to[i]).length () < eps);

        // unweighted:
        res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (
            &from[0], &to[0], from.size (), true);
        for (size_t i = 0; i < from.size (); ++i)
            assert ((from[i] * res - to[i]).length () < eps);
    }
    std::cout << "  OK\n";
}